

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  mbedtls_pk_type_t mVar1;
  int iVar2;
  mbedtls_rsa_context *ctx;
  mbedtls_ecp_keypair *ec_00;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t par_len;
  size_t pub_len;
  mbedtls_ecp_keypair *ec;
  mbedtls_rsa_context *rsa;
  mbedtls_mpi T;
  size_t len;
  uchar *c;
  size_t sStack_28;
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  c._4_4_ = 0xffffff92;
  T.p = (mbedtls_mpi_uint *)0x0;
  if (size == 0) {
    return -0x6c;
  }
  len = (size_t)(buf + size);
  sStack_28 = size;
  size_local = (size_t)buf;
  buf_local = (uchar *)key;
  mVar1 = mbedtls_pk_get_type(key);
  if (mVar1 == MBEDTLS_PK_RSA) {
    ctx = mbedtls_pk_rsa(*(mbedtls_pk_context *)buf_local);
    mbedtls_mpi_init((mbedtls_mpi *)&rsa);
    c._4_4_ = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)&rsa);
    if ((c._4_4_ == 0) &&
       (c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
       -1 < c._4_4_)) {
      T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
      c._4_4_ = mbedtls_rsa_export_crt
                          (ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)&rsa,(mbedtls_mpi *)0x0);
      if ((c._4_4_ == 0) &&
         (c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
         -1 < c._4_4_)) {
        T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
        c._4_4_ = mbedtls_rsa_export_crt
                            (ctx,(mbedtls_mpi *)&rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
        if ((c._4_4_ == 0) &&
           (c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa)
           , -1 < c._4_4_)) {
          T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
          c._4_4_ = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)&rsa
                                       ,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
          if ((c._4_4_ == 0) &&
             (c._4_4_ = mbedtls_asn1_write_mpi
                                  ((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
             -1 < c._4_4_)) {
            T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
            c._4_4_ = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)&rsa,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
            if ((c._4_4_ == 0) &&
               (c._4_4_ = mbedtls_asn1_write_mpi
                                    ((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
               -1 < c._4_4_)) {
              T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
              c._4_4_ = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                           (mbedtls_mpi *)0x0,(mbedtls_mpi *)&rsa,(mbedtls_mpi *)0x0
                                          );
              if ((c._4_4_ == 0) &&
                 (c._4_4_ = mbedtls_asn1_write_mpi
                                      ((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
                 -1 < c._4_4_)) {
                T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
                c._4_4_ = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                             (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                             (mbedtls_mpi *)&rsa);
                if ((c._4_4_ == 0) &&
                   (c._4_4_ = mbedtls_asn1_write_mpi
                                        ((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
                   -1 < c._4_4_)) {
                  T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
                  c._4_4_ = mbedtls_rsa_export(ctx,(mbedtls_mpi *)&rsa,(mbedtls_mpi *)0x0,
                                               (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                               (mbedtls_mpi *)0x0);
                  if ((c._4_4_ == 0) &&
                     (c._4_4_ = mbedtls_asn1_write_mpi
                                          ((uchar **)&len,(uchar *)size_local,(mbedtls_mpi *)&rsa),
                     -1 < c._4_4_)) {
                    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
                  }
                }
              }
            }
          }
        }
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)&rsa);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    c._4_4_ = mbedtls_asn1_write_int((uchar **)&len,(uchar *)size_local,0);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,(size_t)T.p);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
    iVar2 = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'0');
    if (iVar2 < 0) {
      return iVar2;
    }
    T.p._0_4_ = iVar2 + (int)T.p;
  }
  else {
    mVar1 = mbedtls_pk_get_type((mbedtls_pk_context *)buf_local);
    if (mVar1 != MBEDTLS_PK_ECKEY) {
      return -0x3980;
    }
    ec_00 = mbedtls_pk_ec(*(mbedtls_pk_context *)buf_local);
    c._4_4_ = pk_write_ec_pubkey((uchar **)&len,(uchar *)size_local,ec_00);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar3 = (long)c._4_4_;
    if ((long)(len - size_local) < 1) {
      return -0x6c;
    }
    *(undefined1 *)(len - 1) = 0;
    len = len - 1;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,lVar3 + 1U);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar4 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'\x03');
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    sVar5 = (long)c._4_4_ + lVar4 + lVar3 + 1U;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,sVar5);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar3 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,0xa1);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + lVar3 + sVar5 + (long)T.p);
    c._4_4_ = pk_write_ec_param((uchar **)&len,(uchar *)size_local,ec_00);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    sVar5 = (size_t)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,sVar5);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar3 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,0xa0);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + lVar3 + sVar5 + (long)T.p);
    c._4_4_ = pk_write_ec_private((uchar **)&len,(uchar *)size_local,ec_00);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
    c._4_4_ = mbedtls_asn1_write_int((uchar **)&len,(uchar *)size_local,1);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,(size_t)T.p);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    T.p = (mbedtls_mpi_uint *)((long)c._4_4_ + (long)T.p);
    iVar2 = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'0');
    if (iVar2 < 0) {
      return iVar2;
    }
    T.p._0_4_ = iVar2 + (int)T.p;
  }
  return (int)T.p;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *c;
    size_t len = 0;

    PK_VALIDATE_RET( key != NULL );
    if( size == 0 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
    PK_VALIDATE_RET( buf != NULL );

    c = buf + size;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_mpi T; /* Temporary holding the exported parameters */
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        /*
         * Export the parameters one after another to avoid simultaneous copies.
         */

        mbedtls_mpi_init( &T );

        /* Export QP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, NULL, &T ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DQ */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, &T, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, &T, NULL, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export Q */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         &T, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export P */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, &T,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export D */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, &T, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export E */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, NULL, &T ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export N */
        if ( ( ret = mbedtls_rsa_export( rsa, &T, NULL,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

    end_of_export:

        mbedtls_mpi_free( &T );
        if( ret < 0 )
            return( ret );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c,
                                               buf, MBEDTLS_ASN1_CONSTRUCTED |
                                               MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey */
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_ec_private( &c, buf, ec ) );

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}